

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execShiftEa<(moira::Instr)14,(moira::Mode)4,(moira::Size)2>(Moira *this,u16 op)

{
  int *piVar1;
  u32 addr;
  u32 uVar2;
  u32 uVar3;
  undefined8 in_RAX;
  bool error;
  bool local_21;
  
  local_21 = SUB81((ulong)in_RAX >> 0x38,0);
  addr = computeEA<(moira::Mode)4,(moira::Size)2,0ul>(this,op & 7);
  uVar2 = readM<(moira::MemSpace)1,(moira::Size)2,64ul>(this,addr,&local_21);
  piVar1 = (int *)((long)this->exec + (ulong)(op & 7) * 4 + -0x38);
  *piVar1 = *piVar1 + -2;
  if (local_21 == false) {
    uVar3 = (this->reg).pc;
    (this->reg).pc0 = uVar3;
    (this->queue).ird = (this->queue).irc;
    uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar3 + 2);
    (this->queue).irc = (u16)uVar3;
    uVar2 = shift<(moira::Instr)14,(moira::Size)2>(this,1,(ulong)uVar2);
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,addr,uVar2);
  }
  return;
}

Assistant:

void
Moira::execShiftEa(u16 op)
{
    int src = _____________xxx(op);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    prefetch();

    writeM<M,S, POLLIPL>(ea, shift<I,S>(1, data));
}